

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeEventDestroyEpilogue
          (ZEbasic_leakChecker *this,ze_event_handle_t param_1,ze_result_t result)

{
  allocator local_41;
  string local_40 [36];
  ze_result_t local_1c;
  ze_event_handle_t p_Stack_18;
  ze_result_t result_local;
  ze_event_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  local_1c = result;
  if (result == ZE_RESULT_SUCCESS) {
    p_Stack_18 = param_1;
    param_1_local = (ze_event_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"zeEventDestroy",&local_41);
    countFunctionCall(this,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return local_1c;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeEventDestroyEpilogue(ze_event_handle_t, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeEventDestroy");
        }
        return result;
    }